

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAigToLogicSopNand(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int local_38;
  int local_34;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar1 != 0) {
      printf("Warning: Choice nodes are skipped.\n");
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_34);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_38 < iVar1;
            local_38 = local_38 + 1) {
          pAVar3 = Abc_ObjFanin(pAVar2,local_38);
          iVar1 = Abc_ObjIsNode(pAVar3);
          if (iVar1 != 0) {
            Abc_ObjXorFaninC(pAVar2,local_38);
          }
        }
      }
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    p = Abc_NtkDfs(pNtk,0);
    pAVar2 = Abc_AigConst1(pNtk);
    iVar1 = Abc_ObjFanoutNum(pAVar2);
    if (0 < iVar1) {
      pAVar3 = Abc_NtkCreateNodeConst1(pNtk_00);
      (pAVar2->field_6).pCopy = pAVar3;
    }
    iVar1 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar2);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar2->field_6).pCopy);
      (((pAVar2->field_6).pCopy)->field_6).pCopy = pAVar3;
    }
    for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_34);
      iVar1 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar2->field_6).pCopy);
        (((pAVar2->field_6).pCopy)->field_6).pCopy = pAVar3;
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
      Abc_NtkDupObj(pNtk_00,pAVar2,0);
      pcVar4 = Abc_SopCreateNand((Mem_Flex_t *)pNtk_00->pManFunc,2);
      (((pAVar2->field_6).pCopy)->field_5).pData = pcVar4;
      iVar1 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar2->field_6).pCopy);
        (((pAVar2->field_6).pCopy)->field_6).pCopy = pAVar3;
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
      for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_38 < iVar1; local_38 = local_38 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_38);
        iVar1 = Abc_ObjFaninC(pAVar2,local_38);
        if (iVar1 == 0) {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pAVar3->field_6).pCopy);
        }
        else {
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,(((pAVar3->field_6).pCopy)->field_6).pCopy);
        }
      }
    }
    Vec_PtrFree(p);
    for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_34);
      pAVar3 = Abc_ObjFanin0(pAVar2);
      iVar1 = Abc_ObjFaninC0(pAVar2);
      if (iVar1 == 0) {
        Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pAVar3->field_6).pCopy);
      }
      else {
        Abc_ObjAddFanin((pAVar2->field_6).pCopy,(((pAVar3->field_6).pCopy)->field_6).pCopy);
      }
    }
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_34);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_38 < iVar1;
            local_38 = local_38 + 1) {
          pAVar3 = Abc_ObjFanin(pAVar2,local_38);
          iVar1 = Abc_ObjIsNode(pAVar3);
          if (iVar1 != 0) {
            Abc_ObjXorFaninC(pAVar2,local_38);
          }
        }
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      printf("Warning: The EXDc network is skipped.\n");
    }
    iVar1 = Abc_NtkCheck(pNtk_00);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkAigToLogicSopBench(): Network check has failed.\n");
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                ,0x1a0,"Abc_Ntk_t *Abc_NtkAigToLogicSopNand(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSopNand( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkGetChoiceNum(pNtk) )
        printf( "Warning: Choice nodes are skipped.\n" );
    // convert complemented edges
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) )
                Abc_ObjXorFaninC( pObj, k );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // collect the nodes to be used (marks all nodes with current TravId)
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create inverters for the constant node
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
        pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // create inverters for the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // duplicate the nodes, create node functions, and inverters
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pObj->pCopy->pData = Abc_SopCreateNand( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    }
    // connect the objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_ObjFaninC( pObj, k ) )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }